

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O3

void __thiscall HighsLpRelaxation::storeDualUBProof(HighsLpRelaxation *this)

{
  pointer piVar1;
  pointer pdVar2;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var3;
  bool bVar4;
  
  piVar1 = (this->dualproofinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->dualproofinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->dualproofinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  pdVar2 = (this->dualproofvals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->dualproofvals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->dualproofvals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  if ((this->lpsolver).solution_.dual_valid == false) {
    this->hasdualproof = false;
  }
  else {
    _Var3._M_head_impl =
         (this->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    bVar4 = computeDualProof(this,&(_Var3._M_head_impl)->domain,(_Var3._M_head_impl)->upper_limit,
                             &this->dualproofinds,&this->dualproofvals,&this->dualproofrhs,true);
    this->hasdualproof = bVar4;
    if (bVar4) {
      return;
    }
  }
  this->dualproofrhs = INFINITY;
  return;
}

Assistant:

void HighsLpRelaxation::storeDualUBProof() {
  assert(lpsolver.getModelStatus() == HighsModelStatus::kObjectiveBound);

  dualproofinds.clear();
  dualproofvals.clear();

  if (lpsolver.getSolution().dual_valid)
    hasdualproof = computeDualProof(mipsolver.mipdata_->domain,
                                    mipsolver.mipdata_->upper_limit,
                                    dualproofinds, dualproofvals, dualproofrhs);
  else
    hasdualproof = false;

  if (!hasdualproof) dualproofrhs = kHighsInf;
}